

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

string * __thiscall
pbrt::syntactic::ParamArray<bool>::toString_abi_cxx11_
          (string *__return_storage_ptr__,ParamArray<bool> *this)

{
  ostream *poVar1;
  size_t i;
  ulong __n;
  stringstream ss;
  string asStack_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  (**(this->super_Param)._vptr_Param)(asStack_1d8,this);
  poVar1 = std::operator<<(local_1a8,asStack_1d8);
  std::operator<<(poVar1," ");
  std::__cxx11::string::~string(asStack_1d8);
  std::operator<<(local_1a8,"[ ");
  for (__n = 0; __n < (ulong)(this->super_vector<bool,_std::allocator<bool>_>).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                      ((long)(this->super_vector<bool,_std::allocator<bool>_>).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                      (long)(this->super_vector<bool,_std::allocator<bool>_>).
                            super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
      __n = __n + 1) {
    std::vector<bool,_std::allocator<bool>_>::operator[]
              (&this->super_vector<bool,_std::allocator<bool>_>,__n);
    poVar1 = std::ostream::_M_insert<bool>(SUB81(local_1a8,0));
    std::operator<<(poVar1," ");
  }
  std::operator<<(local_1a8,"]");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string ParamArray<bool>::toString() const
    { 
      std::stringstream ss;
      ss << getType() << " ";
      ss << "[ ";
      for (size_t i=0;i<this->size();i++)
        ss << get(i) << " ";
      ss << "]";
      return ss.str();
    }